

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O2

void __thiscall D5xNvmFlash::command(D5xNvmFlash *this,uint8_t cmd)

{
  uint16_t uVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AH;
  undefined6 extraout_var;
  undefined7 in_register_00000031;
  
  waitReady(this);
  writeRegU32(this,'\x04',(uint)CONCAT71(in_register_00000031,cmd) | 0xa500);
  waitReady(this);
  uVar1 = readRegU16(this,'\x10');
  if ((uVar1 & 0xce) == 0) {
    return;
  }
  writeRegU16(this,'\x10',0xce);
  __cxa_allocate_exception(8);
  *(undefined ***)CONCAT62(extraout_var,CONCAT11(extraout_AH,extraout_AL)) =
       &PTR__exception_001177c8;
  __cxa_throw(CONCAT62(extraout_var,CONCAT11(extraout_AH,extraout_AL)),&FlashCmdError::typeinfo,
              std::exception::~exception);
}

Assistant:

void
D5xNvmFlash::command(uint8_t cmd)
{
    waitReady();

    writeRegU32(NVM_REG_CTRLB, CMDEX_KEY | cmd);

    waitReady();

    if (readRegU16(NVM_REG_INTFLAG) & 0xce)
    {
        // Clear the error bits
        writeRegU16(NVM_REG_INTFLAG, 0xce);
        throw FlashCmdError();
    }
}